

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_mont.c
# Opt level: O0

int ec_GFp_mont_field_set_to_one(EC_GROUP *group,BIGNUM *r,BN_CTX *ctx)

{
  BIGNUM *pBVar1;
  BIGNUM *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    local_4 = 0;
  }
  else {
    pBVar1 = BN_copy(in_RSI,*(BIGNUM **)(in_RDI + 0x40));
    if (pBVar1 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ec_GFp_mont_field_set_to_one(const EC_GROUP *group, BIGNUM *r,
                                 BN_CTX *ctx)
{
    if (group->field_data2 == NULL) {
        // //ECerr(EC_F_EC_GFP_MONT_FIELD_SET_TO_ONE, EC_R_NOT_INITIALIZED);
        return 0;
    }

    if (!BN_copy(r, group->field_data2))
        return 0;
    return 1;
}